

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::TryConsume(ParserImpl *this,string *value)

{
  __type _Var1;
  Token *pTVar2;
  string *value_local;
  ParserImpl *this_local;
  
  pTVar2 = io::Tokenizer::current(&this->tokenizer_);
  _Var1 = std::operator==(&pTVar2->text,value);
  if (_Var1) {
    io::Tokenizer::Next(&this->tokenizer_);
  }
  return _Var1;
}

Assistant:

bool TryConsume(const string& value) {
    if (tokenizer_.current().text == value) {
      tokenizer_.Next();
      return true;
    } else {
      return false;
    }
  }